

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreePatterns.cpp
# Opt level: O1

bool __thiscall
IRT::MemPattern::TryToGenerateCode
          (MemPattern *this,INode *tree,CTemp *dest,ChildrenTemps *children,
          AssemblyCommands *commands)

{
  undefined8 this_00;
  CMemExpression *this_01;
  CExpression *pCVar1;
  CTempExpression *this_02;
  CTemp *__args_1;
  CTemp source;
  element_type *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  undefined1 local_98 [24];
  undefined1 local_80 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  CTemp local_50;
  
  if (tree == (INode *)0x0) {
    this_01 = (CMemExpression *)0x0;
  }
  else {
    this_01 = (CMemExpression *)__dynamic_cast(tree,&INode::typeinfo,&CMemExpression::typeinfo,0);
  }
  if (this_01 != (CMemExpression *)0x0) {
    pCVar1 = CMemExpression::getAddress(this_01);
    if (pCVar1 == (CExpression *)0x0) {
      this_02 = (CTempExpression *)0x0;
    }
    else {
      this_02 = (CTempExpression *)
                __dynamic_cast(pCVar1,&CExpression::typeinfo,&CTempExpression::typeinfo,0);
    }
    if (this_02 == (CTempExpression *)0x0) {
      CTemp::CTemp(&local_50);
      pCVar1 = CMemExpression::getAddress(this_01);
      local_a8 = (element_type *)local_98;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a8,local_50.name._M_dataplus._M_p,
                 local_50.name._M_dataplus._M_p + local_50.name._M_string_length);
      if (local_a8 == (element_type *)local_98) {
        local_80._24_8_ = local_98._8_8_;
        local_80._0_8_ = (element_type *)(local_80 + 0x10);
      }
      else {
        local_80._0_8_ = local_a8;
      }
      local_80._8_8_ = local_a0;
      local_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_98[0] = 0;
      local_a8 = (element_type *)local_98;
      local_98._16_8_ = pCVar1;
      local_60._M_allocated_capacity = (size_type)pCVar1;
      local_60._8_8_ = commands;
      std::
      vector<std::pair<IRT::CTemp,IRT::INode_const*>,std::allocator<std::pair<IRT::CTemp,IRT::INode_const*>>>
      ::emplace_back<std::pair<IRT::CTemp,IRT::INode_const*>>
                ((vector<std::pair<IRT::CTemp,IRT::INode_const*>,std::allocator<std::pair<IRT::CTemp,IRT::INode_const*>>>
                  *)children,(pair<IRT::CTemp,_const_IRT::INode_*> *)local_80);
      if ((element_type *)local_80._0_8_ != (element_type *)(local_80 + 0x10)) {
        operator_delete((void *)local_80._0_8_);
      }
      this_00 = local_60._8_8_;
      if (local_a8 != (element_type *)local_98) {
        operator_delete(local_a8);
      }
      local_80._0_8_ = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<AssemblyCode::MoveRegMemCommand,std::allocator<AssemblyCode::MoveRegMemCommand>,IRT::CTemp_const&,IRT::CTemp&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 8),
                 (MoveRegMemCommand **)local_80,
                 (allocator<AssemblyCode::MoveRegMemCommand> *)&local_a8,dest,&local_50);
      std::
      vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
      ::emplace_back<std::shared_ptr<AssemblyCode::MoveRegMemCommand>>
                ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                  *)this_00,(shared_ptr<AssemblyCode::MoveRegMemCommand> *)local_80);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50.name._M_dataplus._M_p != &local_50.name.field_2) {
        operator_delete(local_50.name._M_dataplus._M_p);
      }
    }
    else {
      __args_1 = CTempExpression::getTemprorary(this_02);
      local_80._0_8_ = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<AssemblyCode::MoveRegMemCommand,std::allocator<AssemblyCode::MoveRegMemCommand>,IRT::CTemp_const&,IRT::CTemp_const&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 8),
                 (MoveRegMemCommand **)local_80,
                 (allocator<AssemblyCode::MoveRegMemCommand> *)&local_a8,dest,__args_1);
      std::
      vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
      ::emplace_back<std::shared_ptr<AssemblyCode::MoveRegMemCommand>>
                ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                  *)commands,(shared_ptr<AssemblyCode::MoveRegMemCommand> *)local_80);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_);
      }
    }
  }
  return this_01 != (CMemExpression *)0x0;
}

Assistant:

bool IRT::MemPattern::TryToGenerateCode( const IRT::INode *tree, const IRT::CTemp &dest, ChildrenTemps &children,
                                         AssemblyCommands &commands ) {
    ConstMemPtr memPtr = dynamic_cast<ConstMemPtr>(tree);
    if ( memPtr ) {
        ConstTempPtr constTempPtr = dynamic_cast<ConstTempPtr>(memPtr->getAddress( ));
        if ( constTempPtr ) {
            commands.emplace_back(
                    std::make_shared<AssemblyCode::MoveRegMemCommand>( dest, constTempPtr->getTemprorary( )));
        } else {
            CTemp source;
            children.push_back( std::make_pair( source, memPtr->getAddress( )));
            commands.emplace_back( std::make_shared<AssemblyCode::MoveRegMemCommand>( dest, source ));
        }
        return true;
    }
    return false;
}